

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkcell.c
# Opt level: O3

void * createcell68k(uint type)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  DLword *pDVar9;
  uint uVar10;
  uint uVar11;
  LispPTR *base;
  ulong uVar12;
  ulong uVar13;
  DLword *pDVar14;
  long lVar15;
  uint uVar16;
  int iVar18;
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  int iVar30;
  int iVar35;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  int iVar36;
  int iVar38;
  undefined1 auVar37 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar41 [16];
  
  pDVar9 = DTDspace;
  uVar16 = type << 4;
  uVar12 = (ulong)(type * 2);
  if (DTDspace[(ulong)uVar16 + uVar12 + 2] == 0) {
    error("createcell : Attempt to create a cell not declared yet");
  }
  uVar10 = *(uint *)(pDVar9 + (ulong)uVar16 + uVar12 + 4);
  pDVar14 = Lisp_world;
  while (uVar10 = uVar10 & 0xfffffff, Lisp_world = pDVar14, uVar10 == 0) {
    base = alloc_mdspage(pDVar9[(ulong)uVar16 + uVar12 + 0x11]);
    uVar10 = initmdspage(base,pDVar9[(ulong)uVar16 + uVar12 + 2],0);
    *(uint *)(pDVar9 + (ulong)uVar16 + uVar12 + 4) = uVar10;
    pDVar14 = Lisp_world;
    if ((uVar10 >> 0x1b & 1) != 0) {
      error("bad entry on free chain.");
      uVar10 = *(uint *)(pDVar9 + (ulong)uVar16 + uVar12 + 4);
      pDVar14 = Lisp_world;
    }
  }
  uVar11 = *(uint *)(pDVar14 + uVar10);
  if (uVar11 == 0xe0001) {
    error("N_OP_createcell E0001 error");
    uVar11 = *(uint *)(pDVar14 + uVar10);
  }
  *(uint *)(pDVar9 + (ulong)uVar16 + uVar12 + 4) = uVar11 & 0xfffffff;
  if ((uVar11 >> 0x1b & 1) != 0) {
    error("bad entry on free chain.");
  }
  *(int *)(pDVar9 + (ulong)uVar16 + uVar12 + 0xc) =
       *(int *)(pDVar9 + (ulong)uVar16 + uVar12 + 0xc) + 1;
  auVar8 = _DAT_00146770;
  auVar7 = _DAT_00146760;
  auVar6 = _DAT_00146750;
  auVar5 = _DAT_00146740;
  auVar4 = _DAT_00143d50;
  if ((ulong)pDVar9[(ulong)uVar16 + uVar12 + 2] != 0) {
    uVar12 = (ulong)pDVar9[(ulong)uVar16 + uVar12 + 2] + 0x7fffffffffffffff;
    uVar13 = uVar12 & 0x7fffffffffffffff;
    auVar17._8_4_ = (int)uVar13;
    auVar17._0_8_ = uVar13;
    auVar17._12_4_ = (int)(uVar13 >> 0x20);
    pDVar14 = pDVar14 + (ulong)uVar10 + 7;
    lVar15 = 0;
    auVar17 = auVar17 ^ _DAT_00143d50;
    do {
      auVar29._8_4_ = (int)lVar15;
      auVar29._0_8_ = lVar15;
      auVar29._12_4_ = (int)((ulong)lVar15 >> 0x20);
      auVar21 = (auVar29 | auVar8) ^ auVar4;
      iVar30 = auVar17._0_4_;
      iVar36 = -(uint)(iVar30 < auVar21._0_4_);
      iVar18 = auVar17._4_4_;
      auVar22._4_4_ = -(uint)(iVar18 < auVar21._4_4_);
      iVar35 = auVar17._8_4_;
      iVar38 = -(uint)(iVar35 < auVar21._8_4_);
      iVar19 = auVar17._12_4_;
      auVar22._12_4_ = -(uint)(iVar19 < auVar21._12_4_);
      auVar32._4_4_ = iVar36;
      auVar32._0_4_ = iVar36;
      auVar32._8_4_ = iVar38;
      auVar32._12_4_ = iVar38;
      auVar39 = pshuflw(in_XMM11,auVar32,0xe8);
      auVar24._4_4_ = -(uint)(auVar21._4_4_ == iVar18);
      auVar24._12_4_ = -(uint)(auVar21._12_4_ == iVar19);
      auVar24._0_4_ = auVar24._4_4_;
      auVar24._8_4_ = auVar24._12_4_;
      auVar41 = pshuflw(in_XMM12,auVar24,0xe8);
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      auVar40 = pshuflw(auVar39,auVar22,0xe8);
      auVar21._8_4_ = 0xffffffff;
      auVar21._0_8_ = 0xffffffffffffffff;
      auVar21._12_4_ = 0xffffffff;
      auVar21 = (auVar40 | auVar41 & auVar39) ^ auVar21;
      auVar21 = packssdw(auVar21,auVar21);
      if ((auVar21 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((ulong)(pDVar14 + -7) ^ 2) = 0;
      }
      auVar22 = auVar24 & auVar32 | auVar22;
      auVar21 = packssdw(auVar22,auVar22);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 ^ auVar40,auVar21 ^ auVar40);
      if ((auVar21._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)((ulong)(pDVar14 + -6) ^ 2) = 0;
      }
      auVar21 = (auVar29 | auVar7) ^ auVar4;
      iVar36 = -(uint)(iVar30 < auVar21._0_4_);
      auVar37._4_4_ = -(uint)(iVar18 < auVar21._4_4_);
      iVar38 = -(uint)(iVar35 < auVar21._8_4_);
      auVar37._12_4_ = -(uint)(iVar19 < auVar21._12_4_);
      auVar23._4_4_ = iVar36;
      auVar23._0_4_ = iVar36;
      auVar23._8_4_ = iVar38;
      auVar23._12_4_ = iVar38;
      auVar31._4_4_ = -(uint)(auVar21._4_4_ == iVar18);
      auVar31._12_4_ = -(uint)(auVar21._12_4_ == iVar19);
      auVar31._0_4_ = auVar31._4_4_;
      auVar31._8_4_ = auVar31._12_4_;
      auVar37._0_4_ = auVar37._4_4_;
      auVar37._8_4_ = auVar37._12_4_;
      auVar21 = auVar31 & auVar23 | auVar37;
      auVar21 = packssdw(auVar21,auVar21);
      auVar1._8_4_ = 0xffffffff;
      auVar1._0_8_ = 0xffffffffffffffff;
      auVar1._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 ^ auVar1,auVar21 ^ auVar1);
      if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((ulong)(pDVar14 + -5) ^ 2) = 0;
      }
      auVar24 = pshufhw(auVar23,auVar23,0x84);
      auVar32 = pshufhw(auVar31,auVar31,0x84);
      auVar22 = pshufhw(auVar24,auVar37,0x84);
      auVar25._8_4_ = 0xffffffff;
      auVar25._0_8_ = 0xffffffffffffffff;
      auVar25._12_4_ = 0xffffffff;
      auVar25 = (auVar22 | auVar32 & auVar24) ^ auVar25;
      auVar24 = packssdw(auVar25,auVar25);
      if ((auVar24 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((ulong)(pDVar14 + -4) ^ 2) = 0;
      }
      auVar24 = (auVar29 | auVar6) ^ auVar4;
      iVar36 = -(uint)(iVar30 < auVar24._0_4_);
      auVar27._4_4_ = -(uint)(iVar18 < auVar24._4_4_);
      iVar38 = -(uint)(iVar35 < auVar24._8_4_);
      auVar27._12_4_ = -(uint)(iVar19 < auVar24._12_4_);
      auVar33._4_4_ = iVar36;
      auVar33._0_4_ = iVar36;
      auVar33._8_4_ = iVar38;
      auVar33._12_4_ = iVar38;
      auVar21 = pshuflw(auVar21,auVar33,0xe8);
      auVar26._4_4_ = -(uint)(auVar24._4_4_ == iVar18);
      auVar26._12_4_ = -(uint)(auVar24._12_4_ == iVar19);
      auVar26._0_4_ = auVar26._4_4_;
      auVar26._8_4_ = auVar26._12_4_;
      auVar24 = pshuflw(auVar41 & auVar39,auVar26,0xe8);
      in_XMM12 = auVar24 & auVar21;
      auVar27._0_4_ = auVar27._4_4_;
      auVar27._8_4_ = auVar27._12_4_;
      auVar21 = pshuflw(auVar21,auVar27,0xe8);
      auVar39._8_4_ = 0xffffffff;
      auVar39._0_8_ = 0xffffffffffffffff;
      auVar39._12_4_ = 0xffffffff;
      auVar39 = (auVar21 | in_XMM12) ^ auVar39;
      in_XMM11 = packssdw(auVar39,auVar39);
      if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((ulong)(pDVar14 + -3) ^ 2) = 0;
      }
      auVar27 = auVar26 & auVar33 | auVar27;
      auVar21 = packssdw(auVar27,auVar27);
      auVar41._8_4_ = 0xffffffff;
      auVar41._0_8_ = 0xffffffffffffffff;
      auVar41._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 ^ auVar41,auVar21 ^ auVar41);
      if ((auVar21 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)((ulong)(pDVar14 + -2) ^ 2) = 0;
      }
      auVar21 = (auVar29 | auVar5) ^ auVar4;
      iVar30 = -(uint)(iVar30 < auVar21._0_4_);
      auVar34._4_4_ = -(uint)(iVar18 < auVar21._4_4_);
      iVar35 = -(uint)(iVar35 < auVar21._8_4_);
      auVar34._12_4_ = -(uint)(iVar19 < auVar21._12_4_);
      auVar28._4_4_ = iVar30;
      auVar28._0_4_ = iVar30;
      auVar28._8_4_ = iVar35;
      auVar28._12_4_ = iVar35;
      auVar20._4_4_ = -(uint)(auVar21._4_4_ == iVar18);
      auVar20._12_4_ = -(uint)(auVar21._12_4_ == iVar19);
      auVar20._0_4_ = auVar20._4_4_;
      auVar20._8_4_ = auVar20._12_4_;
      auVar34._0_4_ = auVar34._4_4_;
      auVar34._8_4_ = auVar34._12_4_;
      auVar21 = auVar20 & auVar28 | auVar34;
      auVar21 = packssdw(auVar21,auVar21);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 ^ auVar2,auVar21 ^ auVar2);
      if ((auVar21 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((ulong)(pDVar14 + -1) ^ 2) = 0;
      }
      auVar29 = pshufhw(auVar28,auVar28,0x84);
      auVar21 = pshufhw(auVar20,auVar20,0x84);
      auVar24 = pshufhw(auVar29,auVar34,0x84);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar21 = packssdw(auVar21 & auVar29,(auVar24 | auVar21 & auVar29) ^ auVar3);
      if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((ulong)pDVar14 ^ 2) = 0;
      }
      lVar15 = lVar15 + 8;
      pDVar14 = pDVar14 + 8;
    } while ((uVar13 - ((uint)uVar12 & 7)) + 8 != lVar15);
  }
  if ((-1 < *(short *)((ulong)(uVar10 >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2)) &&
     (*GcDisabled_word != 0x4c)) {
    if (*Reclaim_cnt_word == 0) {
      rec_htfind(uVar10,1);
    }
    else {
      htfind(uVar10,1);
    }
  }
  return (void *)((ulong)(uVar10 * 2) + (long)Lisp_world);
}

Assistant:

void *createcell68k(unsigned int type) {
  struct dtd *dtd68k;
  DLword *ptr, *lastptr;
  LispPTR newcell;
#ifdef DTDDEBUG
  if (type == TYPE_LISTP) error("createcell : Can't create Listp cell with CREATECELL");
  if (type == TYPE_STREAM) stab();

  check_dtd_chain(type);

#endif

  dtd68k = (struct dtd *)GetDTD(type);

  if (dtd68k->dtd_size == 0) error("createcell : Attempt to create a cell not declared yet");

retry:
  if ((newcell = (dtd68k->dtd_free & POINTERMASK)) != NIL) {
#ifdef DTDDEBUG
    if (type != GetTypeNumber(newcell)) error("createcell : BAD cell in dtdfree");
    if (newcell > POINTERMASK) error("createcell : BAD Lisp address");
#endif

    ptr = NativeAligned2FromLAddr(newcell);

    if (917505 == *(LispPTR *)ptr) error("N_OP_createcell E0001 error");

    /* replace dtd_free with newcell's top DLword (it may keep next chain)*/
    dtd68k->dtd_free = (*((LispPTR *)ptr)) & POINTERMASK;
    if (dtd68k->dtd_free & 0x8000000) error("bad entry on free chain.");

#ifdef DTDDEBUG
    if ((dtd68k->dtd_free != 0) && (type != GetTypeNumber(dtd68k->dtd_free)))
      error("createcell : BAD cell in next dtdfree");
    check_dtd_chain(type);

#endif

    dtd68k->dtd_oldcnt++;

    /* clear 0  */
    for (lastptr = ptr + dtd68k->dtd_size; ptr != lastptr; ptr++) { GETWORD(ptr) = 0; }

    /*	IncAllocCnt(1); */
    GCLOOKUP(newcell, DELREF);

#ifdef DTDDEBUG
    check_dtd_chain(type);
#endif

    return (NativeAligned2FromLAddr(newcell)); /* XXX: is it really only aligned(2)? */

  } else {
    dtd68k->dtd_free = initmdspage(alloc_mdspage(dtd68k->dtd_typeentry), dtd68k->dtd_size, NIL);
    if (dtd68k->dtd_free & 0x8000000) error("bad entry on free chain.");

#ifdef DTDDEBUG
    check_dtd_chain(type);
#endif

    goto retry;
  }

}